

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O0

BoolExpr * make_boolean_expr(List *ls)

{
  TokenType TVar1;
  char *pcVar2;
  BoolExpr *pBVar3;
  int local_9c;
  char local_98 [4];
  int i;
  char buf [128];
  List *ls_local;
  
  buf._120_8_ = ls;
  if (ls == (List *)0x0) {
    parse_error((List *)0x0,"Invalid boolean expression.\n");
  }
  else {
    if (ls->car == (ListStruct *)0x0) {
      TVar1 = (ls->token).type;
      if (TVar1 != TOK_FALSE) {
        if (TVar1 == TOK_TRUE) {
          ls_local = (List *)&true_bool_expr;
          return (BoolExpr *)ls_local;
        }
        if (TVar1 != TOK_NIL) {
          pcVar2 = unparse_token(&ls->token,local_98);
          parse_error(ls,"Unknown boolean expression \"%s\".\n",pcVar2);
          goto LAB_0010a9e7;
        }
      }
      ls_local = (List *)&false_bool_expr;
      return (BoolExpr *)ls_local;
    }
    for (local_9c = 9; -1 < local_9c; local_9c = local_9c + -1) {
      if (make_boolean_expr::boolop[local_9c].type == (ls->car->token).type) {
        pBVar3 = (*make_boolean_expr::boolop[local_9c].func)(ls->car);
        return pBVar3;
      }
    }
    pcVar2 = unparse_token(&ls->car->token,local_98);
    parse_error(ls,"Unknown boolean operator: \"%s\"\n",pcVar2);
  }
LAB_0010a9e7:
  ls_local = (List *)&false_bool_expr;
  return (BoolExpr *)ls_local;
}

Assistant:

BoolExpr *
make_boolean_expr (const List *ls)
{
  char buf[128];
  int i;
  static const BoolDispatchEntry boolop[] = {
    { TOK_EQUAL,            BO_equal         },
    { TOK_GREATER_THAN,     BO_greater_than  },
    { TOK_LESS_THAN,        BO_less_than     },
    { TOK_LESS_OR_EQUAL,    BO_less_or_equal },
    { TOK_GREATER_OR_EQUAL, BO_gr_or_equal   },
    { TOK_NOT_EQUAL,        BO_not_equal     },
    { TOK_NOT,              BO_not           },
    { TOK_AND,              BO_and           },
    { TOK_OR,               BO_or            },
    { TOK_XOR,              BO_xor           } };

  if (ls == NULL)
    parse_error(ls, "Invalid boolean expression.\n");
  else if (ls->car == NULL)
    {
      switch (ls->token.type) {
      case TOK_TRUE:
	return &true_bool_expr;
      case TOK_FALSE:
      case TOK_NIL:
	return &false_bool_expr;
      default:
	break;
      }
      parse_error (ls, "Unknown boolean expression \"%s\".\n",
		   unparse_token (&ls->token, buf));
    }
  else
    {
      for (i = (sizeof boolop / sizeof boolop[0]) - 1; i >= 0; i--)
	if (boolop[i].type == ls->car->token.type)
	  return boolop[i].func (ls->car);
      parse_error (ls, "Unknown boolean operator: \"%s\"\n",
		   unparse_token (&ls->car->token, buf));
    }

  return &false_bool_expr;   /* Default to FALSE, keep compiling */
}